

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O1

int GetDigitalInputSSC32(SSC32 *pSSC32,int channel,int *pValue)

{
  uint8 *writebuf;
  int iVar1;
  int iVar2;
  size_t sVar3;
  ssize_t sVar4;
  char *__s;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  char recvbuf [1];
  char sendbuf [512];
  char local_229 [513];
  
  if ((uint)channel < 4) {
    writebuf = (uint8 *)(local_229 + 1);
    memset(writebuf,0,0x200);
    sprintf((char *)writebuf,"%c\r",(ulong)(channel + 0x41));
    sVar3 = strlen((char *)writebuf);
    iVar1 = WriteDataSSC32(pSSC32,writebuf,(int)sVar3,pSSC32->bytedelayus);
    if (iVar1 == 0) {
      if ((pSSC32->bSaveRawData != 0) && ((FILE *)pSSC32->pfSaveFile != (FILE *)0x0)) {
        fwrite(local_229 + 1,(long)(int)sVar3,1,(FILE *)pSSC32->pfSaveFile);
        fflush((FILE *)pSSC32->pfSaveFile);
      }
      local_229[0] = '\0';
      iVar1 = (pSSC32->RS232Port).DevType;
      if (iVar1 - 1U < 4) {
        iVar1 = (pSSC32->RS232Port).s;
        uVar7 = 0;
        do {
          iVar5 = (int)uVar7;
          sVar4 = recv(iVar1,local_229 + uVar7,(long)(1 - iVar5),0);
          iVar2 = (int)sVar4;
          if (iVar2 < 1) goto LAB_0011be22;
          uVar6 = iVar5 + iVar2;
          uVar7 = (ulong)uVar6;
        } while (uVar6 == 0 || SCARRY4(iVar5,iVar2) != (int)uVar6 < 0);
LAB_0011bde6:
        if ((pSSC32->bSaveRawData != 0) && ((FILE *)pSSC32->pfSaveFile != (FILE *)0x0)) {
          fputc((int)local_229[0],(FILE *)pSSC32->pfSaveFile);
          fflush((FILE *)pSSC32->pfSaveFile);
        }
        *pValue = (uint)(local_229[0] != '0');
        return 0;
      }
      if (iVar1 == 0) {
        iVar1 = *(int *)&(pSSC32->RS232Port).hDev;
        uVar7 = 0;
        do {
          sVar4 = read(iVar1,local_229 + uVar7,(ulong)(1 - (int)uVar7));
          if ((int)sVar4 < 1) goto LAB_0011be22;
          uVar6 = (int)uVar7 + (int)sVar4;
          uVar7 = (ulong)uVar6;
        } while (uVar6 == 0);
        goto LAB_0011bde6;
      }
LAB_0011be22:
      __s = "Error reading data from a SSC32. ";
    }
    else {
      __s = "Error writing data to a SSC32. ";
    }
    puts(__s);
  }
  else {
    printf("Invalid parameter : channel %d.\n",channel);
  }
  return 1;
}

Assistant:

inline int GetDigitalInputSSC32(SSC32* pSSC32, int channel, int* pValue)
{
	char sendbuf[MAX_NB_BYTES_SSC32];
	int sendbuflen = 0;
	char recvbuf[1];
	int recvbuflen = 0;
	char c = 0;
	char v = 0;

	switch (channel)
	{
	case 0: c = 'A'; break;
	case 1: c = 'B'; break;
	case 2: c = 'C'; break;
	case 3: c = 'D'; break;
	default: 
		printf("Invalid parameter : channel %d.\n", channel);
		return EXIT_FAILURE;
	}

	// Prepare data to send to device.
	memset(sendbuf, 0, sizeof(sendbuf));
	sprintf(sendbuf, "%c\r", c);
	sendbuflen = (int)strlen(sendbuf);

	if (WriteDataSSC32(pSSC32, (unsigned char*)sendbuf, sendbuflen, pSSC32->bytedelayus) != EXIT_SUCCESS)
	{
		printf("Error writing data to a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}
	
	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	recvbuflen = 1;

	if (ReadAllRS232Port(&pSSC32->RS232Port, (unsigned char*)recvbuf, recvbuflen) != EXIT_SUCCESS)
	{
		printf("Error reading data from a SSC32. \n");
		return EXIT_FAILURE;
	}
	if ((pSSC32->bSaveRawData)&&(pSSC32->pfSaveFile))
	{
		fwrite(recvbuf, recvbuflen, 1, pSSC32->pfSaveFile);
		fflush(pSSC32->pfSaveFile);
	}

	v = recvbuf[0];
	*pValue = (v == '0')?0:1;

	return EXIT_SUCCESS;
}